

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O2

ErrorCode Escape::loadGraphCSR(char *path,CGraph *cg,int undirected)

{
  ostream *poVar1;
  EdgeIdx *pEVar2;
  VertexIdx *pVVar3;
  ErrorCode EVar4;
  ulong uVar5;
  EdgeIdx nEdges;
  VertexIdx nVertices;
  ifstream in_file;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&in_file,path,_S_in|_S_bin);
  if ((abStack_208[*(long *)(_in_file + -0x18)] & 5) == 0) {
    std::istream::read((char *)&in_file,(long)&nVertices);
    std::istream::read((char *)&in_file,(long)&nEdges);
    cg->nVertices = nVertices;
    cg->nEdges = nEdges;
    pEVar2 = (EdgeIdx *)operator_new__(-(ulong)(nVertices + 1U >> 0x3d != 0) | nVertices * 8 + 8U);
    cg->offsets = pEVar2;
    uVar5 = 0xffffffffffffffff;
    if ((ulong)nEdges < 0x2000000000000000) {
      uVar5 = nEdges * 8;
    }
    pVVar3 = (VertexIdx *)operator_new__(uVar5);
    cg->nbors = pVVar3;
    std::istream::read((char *)&in_file,(long)pEVar2);
    std::istream::read((char *)&in_file,(long)cg->nbors);
    std::ifstream::close();
    EVar4 = ecNone;
    if (*(int *)(abStack_208 + *(long *)(_in_file + -0x18)) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Error occurred at writing time!");
      std::endl<char,std::char_traits<char>>(poVar1);
      EVar4 = ecNone;
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Cannot open file ");
    poVar1 = std::operator<<(poVar1,path);
    std::endl<char,std::char_traits<char>>(poVar1);
    EVar4 = ecIOError;
  }
  std::ifstream::~ifstream(&in_file);
  return EVar4;
}

Assistant:

ErrorCode Escape::loadGraphCSR(const char *path, CGraph &cg, int undirected)
{
    VertexIdx nVertices;
    EdgeIdx nEdges;
    auto in_file = std::ifstream(path, std::ios::in | std::ios::binary);
    if(!in_file) {
        std::cout << "Cannot open file " << path << std::endl;
        return ecIOError;
    }
    in_file.read(reinterpret_cast<char*> (&nVertices), sizeof(nVertices));
    in_file.read(reinterpret_cast<char*>(&nEdges), sizeof(nEdges));

    cg.nVertices = nVertices;
    cg.nEdges = nEdges;

    cg.offsets = new EdgeIdx[cg.nVertices+1];
    cg.nbors = new VertexIdx[cg.nEdges];

    in_file.read(reinterpret_cast<char*>(cg.offsets), (nVertices+1)* sizeof(VertexIdx));
    in_file.read(reinterpret_cast<char*>(cg.nbors), nEdges*sizeof(EdgeIdx));
    in_file.close();
    if(!in_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
    return ecNone;
}